

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::MergeFromImpl
          (MessageLite *this,CodedInputStream *input,ParseFlags parse_flags)

{
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  bool bVar3;
  unsigned_short uVar4;
  int depth;
  uint32_t uVar5;
  DescriptorPool *pDVar6;
  Data *pDVar7;
  MessageFactory *pMVar8;
  TcParseTableBase *pTVar9;
  ulong uVar10;
  TailCallParseFunc p_Var11;
  TcParseTableBase *pTVar12;
  char *failure_msg;
  LogMessage *pLVar13;
  LogMessage local_180;
  Voidify local_169;
  uint local_168;
  uint local_164;
  Nullable<const_char_*> local_160;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  ZeroCopyCodedInputStream *local_150 [3];
  undefined1 local_138 [8];
  ParseContext ctx;
  char *ptr;
  ZeroCopyCodedInputStream zcis;
  ParseFlags parse_flags_local;
  CodedInputStream *input_local;
  MessageLite *this_local;
  TcFieldData local_90;
  TcParseTableBase *local_88;
  ParseContext *local_80;
  MessageFactory *local_78;
  MessageLite *local_70;
  MessageFactory *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  zcis.cis_._4_4_ = parse_flags;
  ZeroCopyCodedInputStream::ZeroCopyCodedInputStream((ZeroCopyCodedInputStream *)&ptr,input);
  depth = io::CodedInputStream::RecursionBudget(input);
  bVar3 = ZeroCopyCodedInputStream::aliasing_enabled((ZeroCopyCodedInputStream *)&ptr);
  local_150[0] = (ZeroCopyCodedInputStream *)&ptr;
  internal::ParseContext::ParseContext<google::protobuf::ZeroCopyCodedInputStream*>
            ((ParseContext *)local_138,depth,bVar3,(char **)&ctx.data_.factory,local_150);
  internal::ParseContext::TrackCorrectEnding((ParseContext *)local_138);
  pDVar6 = io::CodedInputStream::GetExtensionPool(input);
  pDVar7 = internal::ParseContext::data((ParseContext *)local_138);
  pDVar7->pool = pDVar6;
  pMVar8 = io::CodedInputStream::GetExtensionFactory(input);
  pDVar7 = internal::ParseContext::data((ParseContext *)local_138);
  pDVar7->factory = pMVar8;
  local_88 = GetTcParseTable(this);
  local_78 = ctx.data_.factory;
  local_80 = (ParseContext *)local_138;
  local_88 = local_88 + 1;
  local_70 = this;
  while (bVar3 = internal::ParseContext::Done(local_80,(char **)&local_78), pMVar2 = local_70,
        pMVar8 = local_78, pPVar1 = local_80, ((bVar3 ^ 0xffU) & 1) != 0) {
    internal::TcFieldData::TcFieldData(&local_90);
    pTVar12 = local_88;
    pTVar9 = local_88 + -1;
    uVar4 = internal::UnalignedLoad<unsigned_short>((char *)pMVar8);
    uVar10 = (ulong)(int)((uint)uVar4 & (uint)pTVar12[-1].fast_idx_mask);
    if ((uVar10 & 7) != 0) {
      internal::protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   internal::TcParseTableBase::fast_entry(pTVar9,uVar10 >> 3);
    local_58.data =
         ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data.field_0 + 8))->data ^
         (ulong)uVar4;
    p_Var11 = internal::TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data.field_0);
    local_60.data = local_58.data;
    local_78 = (MessageFactory *)
               (*p_Var11)(pMVar2,(char *)pMVar8,pPVar1,(TcFieldData)local_58,pTVar9,0);
    if ((local_78 == (MessageFactory *)0x0) ||
       (uVar5 = internal::EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream),
       uVar5 != 1)) break;
  }
  pTVar12 = local_88 + -1;
  if ((local_88[-1].field_0x9 & 1) == 0) {
    local_88 = pTVar12;
    if (local_78 == (MessageFactory *)0x0) {
      internal::TcParser::VerifyHasBitConsistency(local_70,pTVar12);
    }
    local_68 = local_78;
  }
  else {
    pTVar9 = local_88 + -1;
    local_88 = pTVar12;
    local_68 = (MessageFactory *)(*pTVar9->post_loop_handler)(local_70,(char *)local_78,local_80);
  }
  ctx.data_.factory = local_68;
  if (local_68 == (MessageFactory *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    internal::EpsCopyInputStream::BackUp((EpsCopyInputStream *)local_138,(char *)local_68);
    bVar3 = internal::EpsCopyInputStream::EndedAtEndOfStream((EpsCopyInputStream *)local_138);
    if (bVar3) {
      io::CodedInputStream::SetConsumed(input);
    }
    else {
      uVar5 = internal::EpsCopyInputStream::LastTag((EpsCopyInputStream *)local_138);
      local_164 = absl::lts_20250127::log_internal::GetReferenceableValue(uVar5);
      local_168 = absl::lts_20250127::log_internal::GetReferenceableValue(1);
      local_160 = absl::lts_20250127::log_internal::Check_NEImpl<unsigned_int,unsigned_int>
                            (&local_164,&local_168,"ctx.LastTag() != 1u");
      if (local_160 != (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_160);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                   ,0x14e,failure_msg);
        pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_180);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_169,pLVar13);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_180);
      }
      bVar3 = internal::EpsCopyInputStream::IsExceedingLimit
                        ((EpsCopyInputStream *)local_138,(char *)ctx.data_.factory);
      if (bVar3) {
        this_local._7_1_ = false;
        goto LAB_005660da;
      }
      uVar5 = internal::EpsCopyInputStream::LastTag((EpsCopyInputStream *)local_138);
      io::CodedInputStream::SetLastTag(input,uVar5);
    }
    this_local._7_1_ =
         anon_unknown_15::CheckFieldPresence((ParseContext *)local_138,this,zcis.cis_._4_4_);
  }
LAB_005660da:
  absl_log_internal_check_op_result._4_4_ = 1;
  ZeroCopyCodedInputStream::~ZeroCopyCodedInputStream((ZeroCopyCodedInputStream *)&ptr);
  return this_local._7_1_;
}

Assistant:

bool MessageLite::MergeFromImpl(io::CodedInputStream* input,
                                MessageLite::ParseFlags parse_flags) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = internal::TcParser::ParseLoop(this, ptr, &ctx, GetTcParseTable());
  if (ABSL_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    ABSL_DCHECK_NE(ctx.LastTag(), 1u);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
  } else {
    input->SetConsumed();
  }
  return CheckFieldPresence(ctx, *this, parse_flags);
}